

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int next_arg_offset(rtosc_arg_val_t *cur)

{
  int32_t iVar1;
  int iVar2;
  char *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((*in_RDI == 'a') || (*in_RDI == ' ')) {
    iVar1 = rtosc_av_arr_len((rtosc_arg_val_t *)0x11c67d);
    iVar2 = iVar1 + 1;
  }
  else if (*in_RDI == '-') {
    iVar2 = next_arg_offset((rtosc_arg_val_t *)
                            CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    iVar1 = rtosc_av_rep_has_delta((rtosc_arg_val_t *)0x11c6b2);
    iVar2 = iVar2 + 1 + iVar1;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int next_arg_offset(const rtosc_arg_val_t* cur)
{
    return (cur->type == 'a' || cur->type == ' ')
           ? rtosc_av_arr_len(cur) + 1
           : (cur->type == '-')
               ? 1                                    /* range arg */
                 + next_arg_offset(cur + 1)           /* start arg */
                 + (int) rtosc_av_rep_has_delta(cur)  /* delta arg */
               : 1;
}